

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

RecyclableObject *
Js::JavascriptOperators::CacheIteratorNext(RecyclableObject *iterator,ScriptContext *scriptContext)

{
  ThreadContext *this;
  bool bVar1;
  Var in_RAX;
  RecyclableObject *pRVar2;
  Var local_28;
  Var value;
  
  local_28 = in_RAX;
  GetProperty_InternalSimple(iterator,iterator,0x107,&local_28,scriptContext);
  this = scriptContext->threadContext;
  bVar1 = JavascriptConversion::IsCallable(local_28);
  if (bVar1) {
    pRVar2 = VarTo<Js::RecyclableObject>(local_28);
  }
  else {
    bVar1 = ThreadContext::RecordImplicitException(this);
    if (bVar1) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
    }
    pRVar2 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  return pRVar2;
}

Assistant:

RecyclableObject* JavascriptOperators::CacheIteratorNext(RecyclableObject* iterator, ScriptContext* scriptContext)
    {
        Var nextFunc = JavascriptOperators::GetPropertyNoCache(iterator, PropertyIds::next, scriptContext);

        ThreadContext *threadContext = scriptContext->GetThreadContext();
        if (!JavascriptConversion::IsCallable(nextFunc))
        {
            if (!threadContext->RecordImplicitException())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }
        return VarTo<RecyclableObject>(nextFunc);
    }